

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

void __thiscall
t_swift_generator::generate_swift_struct_equatable_extension
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool is_private)

{
  int *piVar1;
  t_field *ptVar2;
  ostream *poVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  pointer pptVar5;
  char *pcVar6;
  string local_90;
  string local_70;
  string visibility;
  
  pcVar4 = "fileprivate";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar4 = "private";
  }
  pcVar6 = "public";
  if ((int)CONCAT71(in_register_00000009,is_private) != 0) {
    pcVar6 = pcVar4;
  }
  std::__cxx11::string::string((string *)&visibility,pcVar6,(allocator *)&local_90);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,(string *)&visibility);
  poVar3 = std::operator<<(poVar3," func ==(lhs: ");
  type_name_abi_cxx11_(&local_90,this,&tstruct->super_t_type,false,false);
  poVar3 = std::operator<<(poVar3,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,", rhs: ");
  type_name_abi_cxx11_(&local_70,this,&tstruct->super_t_type,false,false);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::operator<<(poVar3,") -> Bool");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  block_open(this,out);
  poVar3 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar3,"return");
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pcVar4 = " true";
    poVar3 = out;
  }
  else {
    if (tstruct->is_union_ == false) {
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while (pptVar5 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
        ptVar2 = *pptVar5;
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"(lhs.");
        maybe_escape_identifier(&local_90,this,&ptVar2->name_);
        poVar3 = std::operator<<(poVar3,(string *)&local_90);
        pcVar4 = " ";
        if (this->gen_cocoa_ != false) {
          pcVar4 = " ?";
        }
        poVar3 = std::operator<<(poVar3,pcVar4);
        poVar3 = std::operator<<(poVar3,"== rhs.");
        maybe_escape_identifier(&local_70,this,&ptVar2->name_);
        poVar3 = std::operator<<(poVar3,(string *)&local_70);
        std::operator<<(poVar3,")");
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        pptVar5 = pptVar5 + 1;
        if (pptVar5 !=
            (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::operator<<(out," &&");
        }
        std::operator<<(out,(string *)&::endl_abi_cxx11_);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      goto LAB_002b2e83;
    }
    block_open(this,out);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"switch (lhs, rhs) {");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar5 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      ptVar2 = *pptVar5;
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"case (.");
      poVar3 = std::operator<<(poVar3,(string *)&ptVar2->name_);
      poVar3 = std::operator<<(poVar3,"(let lval), .");
      poVar3 = std::operator<<(poVar3,(string *)&ptVar2->name_);
      poVar3 = std::operator<<(poVar3,"(let rval)): return lval == rval");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"default: return false");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"}");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar3 = t_generator::indent((t_generator *)this,out);
    pcVar4 = "}()";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
LAB_002b2e83:
  block_close(this,out,true);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&visibility);
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_equatable_extension(ostream& out,
                                                                  t_struct* tstruct,
                                                                  bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";

  indent(out) << visibility << " func ==(lhs: " << type_name(tstruct) << ", rhs: "
              << type_name(tstruct) << ") -> Bool";
  block_open(out);
  indent(out) << "return";

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  if (members.size()) {
    if (!tstruct->is_union()) {
      out << endl;
      indent_up();

      for (m_iter = members.begin(); m_iter != members.end();) {
        t_field* tfield = *m_iter;
        indent(out) << "(lhs." << maybe_escape_identifier(tfield->get_name())
                    << (gen_cocoa_ ? " ?" : " ") << "== rhs." << maybe_escape_identifier(tfield->get_name()) << ")"; // swift 2 ?== operator not in 3?
        if (++m_iter != members.end()) {
          out << " &&";
        }
        out << endl;
      }
      indent_down();
    } else {
      block_open(out);
      indent(out) << "switch (lhs, rhs) {" << endl;
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        t_field* tfield = *m_iter;
        indent(out) << "case (." << tfield->get_name() << "(let lval), ."
                    << tfield->get_name() << "(let rval)): return lval == rval"
                    << endl;
      }
      indent(out) << "default: return false" << endl;
      indent(out) << "}" << endl;
      indent_down();
      indent(out) << "}()" << endl;
    }
  }
  else {
    out << " true" << endl;
  }

  block_close(out);
  out << endl;
}